

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::InternalException::InternalException<unsigned_long,int,int>
          (InternalException *this,string *msg,unsigned_long params,int params_1,int params_2)

{
  undefined4 in_register_0000000c;
  int in_R9D;
  string local_30;
  
  Exception::ConstructMessage<unsigned_long,int,int>
            (&local_30,(Exception *)msg,(string *)params,CONCAT44(in_register_0000000c,params_1),
             params_2,in_R9D);
  duckdb::InternalException::InternalException(this,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

explicit InternalException(const string &msg, ARGS... params)
	    : InternalException(ConstructMessage(msg, params...)) {
	}